

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O2

int Bac_PtrMemory(Vec_Ptr_t *vDes)

{
  int iVar1;
  Vec_Ptr_t *vNtk;
  int iVar2;
  int i;
  undefined1 auVar3 [16];
  
  if (vDes == (Vec_Ptr_t *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = vDes->nCap;
    auVar3._8_4_ = iVar2 >> 0x1f;
    auVar3._0_8_ = (long)iVar2;
    auVar3._12_4_ = 0x45300000;
    iVar2 = (int)(((auVar3._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 8.0 + 16.0);
  }
  for (i = 1; i < vDes->nSize; i = i + 1) {
    vNtk = (Vec_Ptr_t *)Vec_PtrEntry(vDes,i);
    iVar1 = Bac_PtrMemoryNtk(vNtk);
    iVar2 = iVar2 + iVar1;
  }
  return iVar2;
}

Assistant:

int Bac_PtrMemory( Vec_Ptr_t * vDes )
{
    Vec_Ptr_t * vNtk; int i, nBytes = (int)Vec_PtrMemory(vDes);
    Vec_PtrForEachEntryStart( Vec_Ptr_t *, vDes, vNtk, i, 1 )
        nBytes += Bac_PtrMemoryNtk(vNtk);
    return nBytes;
}